

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromMappedGia(Gia_Man_t *p,int fFindEnables,int fUseBuffs)

{
  Vec_Int_t *pVVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Ntk_t *pAVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Abc_Obj_t *pAVar10;
  Gia_Obj_t *pGVar11;
  Abc_Obj_t *pAVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pFanin;
  ulong uVar14;
  ulong uVar15;
  Vec_Ptr_t *p_00;
  int *piVar16;
  Hop_Obj_t *pHVar17;
  int iVar18;
  long lVar19;
  Abc_Ntk_t *pAVar20;
  int iLitE;
  int iLitT;
  Gia_Man_t *local_58;
  Abc_Ntk_t *local_50;
  int local_48;
  int local_44;
  Abc_Obj_t *local_40;
  int *local_38;
  
  pVVar1 = p->vMapping;
  if (((pVVar1 == (Vec_Int_t *)0x0) && (fFindEnables == 0)) && (p->pMuxes == (uint *)0x0)) {
    __assert_fail("Gia_ManHasMapping(p) || p->pMuxes || fFindEnables",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2ea,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  local_48 = fFindEnables;
  if ((fFindEnables != 0) && (p->pMuxes != (uint *)0x0)) {
    __assert_fail("!fFindEnables || !p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x2eb,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  pAVar7 = Abc_NtkAlloc(ABC_NTK_LOGIC,
                        (pVVar1 != (Vec_Int_t *)0x0) + 1 + (uint)(pVVar1 != (Vec_Int_t *)0x0),1);
  pcVar8 = Extra_UtilStrsav(p->pName);
  pAVar7->pName = pcVar8;
  pcVar8 = Extra_UtilStrsav(p->pSpec);
  pAVar7->pSpec = pcVar8;
  Gia_ManFillValue(p);
  local_40 = Abc_NtkCreateNodeConst0(pAVar7);
  local_38 = &local_40->Id;
  p->pObjs->Value = local_40->Id;
  iVar18 = 0;
  while ((iVar18 < p->vCis->nSize - p->nRegs &&
         (pGVar9 = Gia_ManCi(p,iVar18), pGVar9 != (Gia_Obj_t *)0x0))) {
    pAVar10 = Abc_NtkCreatePi(pAVar7);
    pGVar9->Value = pAVar10->Id;
    iVar18 = iVar18 + 1;
  }
  iVar18 = 0;
  while ((iVar18 < p->vCos->nSize - p->nRegs &&
         (pGVar9 = Gia_ManCo(p,iVar18), pGVar9 != (Gia_Obj_t *)0x0))) {
    pAVar10 = Abc_NtkCreatePo(pAVar7);
    pGVar9->Value = pAVar10->Id;
    iVar18 = iVar18 + 1;
  }
  iVar18 = 0;
  local_58 = p;
  local_50 = pAVar7;
  local_44 = fUseBuffs;
  while (((iVar18 < p->nRegs &&
          (pGVar9 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar18), pGVar9 != (Gia_Obj_t *)0x0))
         && (pGVar11 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar18), pAVar7 = local_50,
            pGVar11 != (Gia_Obj_t *)0x0))) {
    pAVar10 = Abc_NtkCreateLatch(local_50);
    pAVar12 = Abc_NtkCreateBi(pAVar7);
    pAVar13 = Abc_NtkCreateBo(pAVar7);
    Abc_ObjAddFanin(pAVar10,pAVar12);
    Abc_ObjAddFanin(pAVar13,pAVar10);
    p = local_58;
    pGVar9->Value = pAVar12->Id;
    pGVar11->Value = pAVar13->Id;
    Abc_LatchSetInit0(pAVar10);
    iVar18 = iVar18 + 1;
  }
  pAVar7 = local_50;
  if (local_48 == 0) {
    if (p->pMuxes == (uint *)0x0) {
      iVar18 = local_58->nObjs;
      p_00 = Vec_PtrAlloc(iVar18);
      p = local_58;
      p_00->nSize = iVar18;
      memset(p_00->pArray,0,(long)iVar18 << 3);
      pAVar7 = local_50;
      for (iVar18 = 1; iVar18 < p->nObjs; iVar18 = iVar18 + 1) {
        iVar3 = Gia_ObjIsLut(p,iVar18);
        if (iVar3 != 0) {
          pGVar9 = Gia_ManObj(p,iVar18);
          if (pGVar9->Value != 0xffffffff) {
            __assert_fail("pObj->Value == ~0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                          ,0x353,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
          }
          iVar3 = Gia_ObjLutSize(p,iVar18);
          piVar16 = local_38;
          if (iVar3 != 0) {
            pAVar10 = Abc_NtkCreateNode(pAVar7);
            for (lVar19 = 0; iVar3 = Gia_ObjLutSize(p,iVar18), pAVar7 = local_50, lVar19 < iVar3;
                lVar19 = lVar19 + 1) {
              piVar16 = Gia_ObjLutFanins(p,iVar18);
              pGVar11 = Gia_ManObj(p,piVar16[lVar19]);
              pAVar12 = Abc_NtkObj(local_50,pGVar11->Value);
              Abc_ObjAddFanin(pAVar10,pAVar12);
            }
            pHVar17 = Abc_ObjHopFromGia((Hop_Man_t *)local_50->pManFunc,p,iVar18,p_00);
            (pAVar10->field_5).pData = pHVar17;
            piVar16 = &pAVar10->Id;
          }
          pGVar9->Value = *piVar16;
        }
      }
      Vec_PtrFree(p_00);
    }
    else {
      lVar19 = 0;
      while ((lVar19 < p->nObjs && (pGVar9 = Gia_ManObj(p,(int)lVar19), pGVar9 != (Gia_Obj_t *)0x0))
            ) {
        if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar9) {
          pAVar10 = Abc_NtkCreateNode(pAVar7);
          pAVar7 = local_50;
          puVar2 = p->pMuxes;
          if ((puVar2 == (uint *)0x0) || (puVar2[lVar19] == 0)) {
            uVar14 = *(ulong *)pGVar9;
            uVar15 = uVar14 & 0x1fffffff;
            if ((uVar15 == 0x1fffffff || (int)(uint)uVar14 < 0) ||
               (((uint)(uVar14 >> 0x20) & 0x1fffffff) <= ((uint)uVar14 & 0x1fffffff))) {
              pAVar12 = Abc_NtkObj(local_50,pGVar9[-uVar15].Value);
              Abc_ObjAddFanin(pAVar10,pAVar12);
              pAVar12 = Abc_NtkObj(pAVar7,pGVar9[-(ulong)(*(uint *)&pGVar9->field_0x4 & 0x1fffffff)]
                                          .Value);
              Abc_ObjAddFanin(pAVar10,pAVar12);
              pcVar8 = Abc_SopCreateAnd((Mem_Flex_t *)pAVar7->pManFunc,2,(int *)0x0);
            }
            else {
              pAVar12 = Abc_NtkObj(local_50,pGVar9[-uVar15].Value);
              Abc_ObjAddFanin(pAVar10,pAVar12);
              pAVar12 = Abc_NtkObj(pAVar7,pGVar9[-(ulong)(*(uint *)&pGVar9->field_0x4 & 0x1fffffff)]
                                          .Value);
              Abc_ObjAddFanin(pAVar10,pAVar12);
              pcVar8 = Abc_SopCreateXor((Mem_Flex_t *)pAVar7->pManFunc,2);
            }
            (pAVar10->field_5).pData = pcVar8;
            uVar14 = *(ulong *)pGVar9;
            if (((uint)uVar14 >> 0x1d & 1) != 0) {
              Abc_SopComplementVar(pcVar8,0);
              uVar14 = *(ulong *)pGVar9;
            }
            if ((uVar14 & 0x2000000000000000) != 0) {
              iVar18 = 1;
              goto LAB_0026edc9;
            }
          }
          else {
            iVar18 = Gia_ObjId(p,pGVar9);
            iVar18 = Abc_Lit2Var(puVar2[iVar18]);
            pGVar11 = Gia_ManObj(p,iVar18);
            pAVar7 = local_50;
            pAVar12 = Abc_NtkObj(local_50,pGVar11->Value);
            Abc_ObjAddFanin(pAVar10,pAVar12);
            pAVar12 = Abc_NtkObj(pAVar7,pGVar9[-((ulong)*(uint *)&pGVar9->field_0x4 & 0x1fffffff)].
                                        Value);
            Abc_ObjAddFanin(pAVar10,pAVar12);
            pAVar12 = Abc_NtkObj(pAVar7,pGVar9[-(*(ulong *)pGVar9 & 0x1fffffff)].Value);
            Abc_ObjAddFanin(pAVar10,pAVar12);
            pcVar8 = Abc_SopCreateMux((Mem_Flex_t *)pAVar7->pManFunc);
            (pAVar10->field_5).pData = pcVar8;
            puVar2 = p->pMuxes;
            if (puVar2 != (uint *)0x0) {
              iVar18 = Gia_ObjId(local_58,pGVar9);
              iVar18 = Abc_LitIsCompl(puVar2[iVar18]);
              if (iVar18 != 0) {
                Abc_SopComplementVar((char *)(pAVar10->field_5).pData,0);
              }
            }
            uVar14 = *(ulong *)pGVar9;
            if ((uVar14 & 0x2000000000000000) != 0) {
              Abc_SopComplementVar((char *)(pAVar10->field_5).pData,1);
              uVar14 = *(ulong *)pGVar9;
            }
            iVar18 = 2;
            p = local_58;
            if (((uint)uVar14 >> 0x1d & 1) != 0) {
LAB_0026edc9:
              Abc_SopComplementVar((char *)(pAVar10->field_5).pData,iVar18);
            }
          }
          pGVar9->Value = pAVar10->Id;
          pAVar7 = local_50;
        }
        lVar19 = lVar19 + 1;
      }
    }
  }
  else {
    iVar18 = 0;
    while ((iVar18 < p->vCos->nSize && (pGVar9 = Gia_ManCo(p,iVar18), pGVar9 != (Gia_Obj_t *)0x0)))
    {
      iVar3 = Gia_ObjIsRi(p,pGVar9);
      if ((iVar3 == 0) ||
         (iVar3 = Gia_ObjIsMuxType(pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)),
         iVar3 == 0)) {
LAB_0026eaef:
        iVar3 = Gia_ObjFaninId0p(p,pGVar9);
        pAVar10 = Abc_NtkFromMappedGia_rec(pAVar7,p,iVar3,*(uint *)pGVar9 >> 0x1d & 1);
      }
      else {
        iVar3 = Gia_ObjId(p,pGVar9);
        pGVar11 = Gia_ManObj(p,iVar3);
        iVar3 = Gia_ObjIsRi(p,pGVar11);
        if (iVar3 == 0) {
          __assert_fail("Gia_ObjIsRi(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar3 = p->vCis->nSize;
        iVar5 = p->vCos->nSize;
        iVar4 = Gia_ObjCioId(pGVar11);
        p = local_58;
        pGVar11 = Gia_ManCi(local_58,(iVar3 - iVar5) + iVar4);
        iVar5 = Gia_ObjId(p,pGVar11);
        iVar4 = Gia_ObjRecognizeMuxLits
                          (p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),&iLitT,
                           &iLitE);
        iLitE = Abc_LitNotCond(iLitE,*(uint *)pGVar9 >> 0x1d & 1);
        iLitT = Abc_LitNotCond(iLitT,*(uint *)pGVar9 >> 0x1d & 1);
        iVar6 = Abc_Lit2Var(iLitT);
        iVar3 = iLitE;
        if (iVar6 == iVar5) {
          iLitE = iLitT;
          iLitT = iVar3;
          iVar4 = Abc_LitNot(iVar4);
        }
        iVar3 = Abc_Lit2Var(iLitE);
        if (iVar3 != iVar5) goto LAB_0026eaef;
        iVar3 = Abc_Lit2Var(iVar4);
        iVar5 = Abc_LitIsCompl(iVar4);
        pAVar12 = Abc_NtkFromMappedGia_rec(pAVar7,local_58,iVar3,iVar5);
        iVar3 = Abc_Lit2Var(iLitT);
        iVar5 = Abc_LitIsCompl(iLitT);
        pAVar13 = Abc_NtkFromMappedGia_rec(pAVar7,local_58,iVar3,iVar5);
        iVar3 = Abc_Lit2Var(iLitE);
        iVar5 = Abc_LitIsCompl(iLitE);
        pFanin = Abc_NtkFromMappedGia_rec(pAVar7,local_58,iVar3,iVar5);
        pAVar10 = Abc_NtkCreateNode(pAVar7);
        Abc_ObjAddFanin(pAVar10,pAVar12);
        Abc_ObjAddFanin(pAVar10,pAVar13);
        p = local_58;
        Abc_ObjAddFanin(pAVar10,pFanin);
        pcVar8 = Abc_SopCreateMux((Mem_Flex_t *)pAVar7->pManFunc);
        (pAVar10->field_5).pData = pcVar8;
      }
      pAVar12 = Abc_NtkCo(pAVar7,iVar18);
      Abc_ObjAddFanin(pAVar12,pAVar10);
      iVar18 = iVar18 + 1;
    }
  }
  iVar18 = local_44;
  if (local_48 == 0) {
    iVar3 = 0;
    while ((iVar3 < p->vCos->nSize && (pGVar9 = Gia_ManCo(p,iVar3), pGVar9 != (Gia_Obj_t *)0x0))) {
      pAVar10 = Abc_NtkObj(pAVar7,pGVar9[-(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff)].Value);
      pAVar12 = Abc_NtkCo(pAVar7,iVar3);
      p = local_58;
      Abc_ObjAddFanin(pAVar12,(Abc_Obj_t *)((ulong)(*(uint *)pGVar9 >> 0x1d & 1) ^ (ulong)pAVar10));
      iVar3 = iVar3 + 1;
    }
  }
  Abc_NtkAddDummyPiNames(pAVar7);
  Abc_NtkAddDummyPoNames(pAVar7);
  Abc_NtkAddDummyBoxNames(pAVar7);
  Abc_NtkLogicMakeSimpleCos(pAVar7,(uint)(iVar18 == 0));
  if (((local_40->field_0x14 & 0xf) != 0) && ((local_40->vFanouts).nSize == 0)) {
    Abc_NtkDeleteObj(local_40);
  }
  iVar18 = p->nRegs;
  if (p->vCis->nSize - iVar18 != pAVar7->vPis->nSize) {
    __assert_fail("Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37c,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if (p->vCos->nSize - iVar18 != pAVar7->vPos->nSize) {
    __assert_fail("Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37d,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  if (iVar18 != pAVar7->nObjCounts[8]) {
    __assert_fail("Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x37e,"Abc_Ntk_t *Abc_NtkFromMappedGia(Gia_Man_t *, int, int)");
  }
  pAVar20 = pAVar7;
  iVar18 = Abc_NtkCheck(pAVar7);
  if (iVar18 == 0) {
    Abc_Print((int)pAVar20,"Abc_NtkFromMappedGia(): Network check has failed.\n");
  }
  return pAVar7;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromMappedGia( Gia_Man_t * p, int fFindEnables, int fUseBuffs )
{
    int fVerbose = 0;
    int fDuplicate = 0;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjNewLi, * pObjNewLo, * pConst0 = NULL;
    Gia_Obj_t * pObj, * pObjLi, * pObjLo;
    Vec_Ptr_t * vReflect;
    int i, k, iFan, nDupGates, nCountMux = 0; 
    assert( Gia_ManHasMapping(p) || p->pMuxes || fFindEnables );
    assert( !fFindEnables || !p->pMuxes );
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, Gia_ManHasMapping(p) ? ABC_FUNC_AIG : ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(p->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(p->pSpec);
    Gia_ManFillValue( p );
    // create constant
    pConst0 = Abc_NtkCreateNodeConst0( pNtkNew );
    Gia_ManConst0(p)->Value = Abc_ObjId(pConst0);
    // create PIs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePi( pNtkNew ) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Abc_ObjId( Abc_NtkCreatePo( pNtkNew ) );
    // create as many latches as there are registers in the manager
    Gia_ManForEachRiRo( p, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjNewLi = Abc_NtkCreateBi( pNtkNew );
        pObjNewLo = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, pObjNewLi );
        Abc_ObjAddFanin( pObjNewLo, pObjNew );
        pObjLi->Value = Abc_ObjId( pObjNewLi );
        pObjLo->Value = Abc_ObjId( pObjNewLo );
        Abc_LatchSetInit0( pObjNew );
    }
    // rebuild the AIG
    if ( fFindEnables )
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            pObjNew = NULL;
            if ( Gia_ObjIsRi(p, pObj) && Gia_ObjIsMuxType(Gia_ObjFanin0(pObj)) )
            {
                int iObjRo = Gia_ObjRiToRoId( p, Gia_ObjId(p, pObj) );
                int iLitE, iLitT, iCtrl = Gia_ObjRecognizeMuxLits( p, Gia_ObjFanin0(pObj), &iLitT, &iLitE );
                iLitE = Abc_LitNotCond( iLitE, Gia_ObjFaninC0(pObj) );
                iLitT = Abc_LitNotCond( iLitT, Gia_ObjFaninC0(pObj) );
                if ( Abc_Lit2Var(iLitT) == iObjRo )
                {
                    int iTemp = iLitE;
                    iLitE = iLitT;
                    iLitT = iTemp;
                    iCtrl = Abc_LitNot( iCtrl );
                }
                if ( Abc_Lit2Var(iLitE) == iObjRo )
                {
                    Abc_Obj_t * pObjCtrl  = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iCtrl), Abc_LitIsCompl(iCtrl) );
                    Abc_Obj_t * pObjNodeT = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitT), Abc_LitIsCompl(iLitT) );
                    Abc_Obj_t * pObjNodeE = Abc_NtkFromMappedGia_rec( pNtkNew, p, Abc_Lit2Var(iLitE), Abc_LitIsCompl(iLitE) );
                    pObjNew = Abc_NtkCreateNode( pNtkNew );
                    Abc_ObjAddFanin( pObjNew, pObjCtrl );
                    Abc_ObjAddFanin( pObjNew, pObjNodeT );
                    Abc_ObjAddFanin( pObjNew, pObjNodeE );
                    pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                    nCountMux++;
                }
            }
            if ( pObjNew == NULL )
                pObjNew = Abc_NtkFromMappedGia_rec( pNtkNew, p, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
            Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
        }
    }
    else if ( p->pMuxes )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            if ( Gia_ObjIsMuxId(p, i) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin2(p, pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                pObjNew->pData = Abc_SopCreateMux( (Mem_Flex_t *)pNtkNew->pManFunc );
                if ( Gia_ObjFaninC2(p, pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
                if ( Gia_ObjFaninC0(pObj) )     Abc_SopComplementVar( (char *)pObjNew->pData, 2 );
            }
            else if ( Gia_ObjIsXor(pObj) )
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateXor( (Mem_Flex_t *)pNtkNew->pManFunc, 2 );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            else 
            {
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj))) );
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ObjFanin1(pObj))) );
                pObjNew->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtkNew->pManFunc, 2, NULL );
                if ( Gia_ObjFaninC0(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 0 );
                if ( Gia_ObjFaninC1(pObj) )  Abc_SopComplementVar( (char *)pObjNew->pData, 1 );
            }
            pObj->Value = Abc_ObjId( pObjNew );
        }
    }
    else
    {
        vReflect = Vec_PtrStart( Gia_ManObjNum(p) );
        Gia_ManForEachLut( p, i )
        {
            pObj = Gia_ManObj(p, i);
            assert( pObj->Value == ~0 );
            if ( Gia_ObjLutSize(p, i) == 0 )
            {
                pObj->Value = Abc_ObjId(pConst0);
                continue;
            }
            pObjNew = Abc_NtkCreateNode( pNtkNew );
            Gia_LutForEachFanin( p, i, iFan, k )
                Abc_ObjAddFanin( pObjNew, Abc_NtkObj(pNtkNew, Gia_ObjValue(Gia_ManObj(p, iFan))) );
            pObjNew->pData = Abc_ObjHopFromGia( (Hop_Man_t *)pNtkNew->pManFunc, p, i, vReflect );
            pObj->Value = Abc_ObjId( pObjNew );
        }
        Vec_PtrFree( vReflect );
    }
    //if ( fFindEnables )
    //    printf( "Extracted %d flop enable signals.\n", nCountMux );
    // connect the PO nodes
    if ( !fFindEnables )
    Gia_ManForEachCo( p, pObj, i )
    {
        pObjNew = Abc_NtkObj( pNtkNew, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), Abc_ObjNotCond( pObjNew, Gia_ObjFaninC0(pObj) ) );
    }
    // create names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, !fUseBuffs );
    if ( fVerbose && nDupGates && !Abc_FrameReadFlag("silentmode") )
    {
        if ( !fDuplicate )
            printf( "Added %d buffers/inverters to decouple the CO drivers.\n", nDupGates );
        else
            printf( "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    }
    // remove const node if it is not used
    if ( !Abc_ObjIsNone(pConst0) && Abc_ObjFanoutNum(pConst0) == 0 )
        Abc_NtkDeleteObj( pConst0 );

    assert( Gia_ManPiNum(p) == Abc_NtkPiNum(pNtkNew) );
    assert( Gia_ManPoNum(p) == Abc_NtkPoNum(pNtkNew) );
    assert( Gia_ManRegNum(p) == Abc_NtkLatchNum(pNtkNew) );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromMappedGia(): Network check has failed.\n" );
    return pNtkNew;
}